

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::RandomBernoulliStaticLayerParams::SerializeWithCachedSizes
          (RandomBernoulliStaticLayerParams *this,CodedOutputStream *output)

{
  float value;
  uint64 value_00;
  int index;
  int iVar1;
  
  if (this->seed_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->seed_,output);
  }
  value = this->prob_;
  if ((value != 0.0) || (NAN(value))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(2,value,output);
  }
  iVar1 = (this->outputshape_).current_size_;
  if (0 < iVar1) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x1a);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_outputshape_cached_byte_size_);
    iVar1 = (this->outputshape_).current_size_;
  }
  index = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
    index = 0;
  }
  for (; iVar1 != index; index = index + 1) {
    value_00 = outputshape(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value_00);
  }
  return;
}

Assistant:

void RandomBernoulliStaticLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.RandomBernoulliStaticLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->seed() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->seed(), output);
  }

  // float prob = 2;
  if (this->prob() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->prob(), output);
  }

  // repeated uint64 outputShape = 3;
  if (this->outputshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(3, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_outputshape_cached_byte_size_);
  }
  for (int i = 0, n = this->outputshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->outputshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.RandomBernoulliStaticLayerParams)
}